

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::PrintOnOneLine(char *str,int max_length)

{
  long lVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((str != (char *)0x0) && (cVar2 = *str, cVar2 != '\0')) {
    pcVar4 = str + 1;
    uVar5 = 0;
    do {
      if (0xf9 < uVar5) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          printf("...");
          return;
        }
        goto LAB_0015703f;
      }
      if (cVar2 == '\n') {
        printf("\\n");
        iVar3 = 2;
      }
      else {
        putchar((int)cVar2);
        iVar3 = 1;
      }
      uVar5 = uVar5 + iVar3;
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar2 != '\0');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0015703f:
  __stack_chk_fail();
}

Assistant:

static void PrintOnOneLine(const char* str, int max_length) {
  if (str != NULL) {
    for (int i = 0; *str != '\0'; ++str) {
      if (i >= max_length) {
        printf("...");
        break;
      }
      if (*str == '\n') {
        printf("\\n");
        i += 2;
      } else {
        printf("%c", *str);
        ++i;
      }
    }
  }
}